

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile
          (DeepScanLineInputFile *this,InputPartData *part)

{
  InputStreamMutex *pIVar1;
  int iVar2;
  Data *pDVar3;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__DeepScanLineInputFile_003ccda0;
  pDVar3 = (Data *)operator_new(0x208);
  Data::Data(pDVar3,part->numThreads);
  this->_data = pDVar3;
  pDVar3->_deleteStream = false;
  pIVar1 = part->mutex;
  pDVar3->_streamData = pIVar1;
  iVar2 = (*pIVar1->is->_vptr_IStream[2])();
  pDVar3 = this->_data;
  pDVar3->memoryMapped = SUB41(iVar2,0);
  pDVar3->version = part->version;
  initialize(this,&part->header);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->_data->lineOffsets,&part->chunkOffsets);
  this->_data->partNumber = part->partNumber;
  return;
}

Assistant:

DeepScanLineInputFile::DeepScanLineInputFile(InputPartData* part)
    
{

    _data = new Data(part->numThreads);
    _data->_deleteStream=false;
    _data->_streamData = part->mutex;
    _data->memoryMapped = _data->_streamData->is->isMemoryMapped();
    _data->version = part->version;

    try
    {
       initialize(part->header);
    }
    catch(...)
    {
        delete _data;
        throw;
    }
    _data->lineOffsets = part->chunkOffsets;

    _data->partNumber = part->partNumber;
}